

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

int __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveSparse(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *feastol)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int32_t iVar11;
  int iVar12;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar13;
  int *piVar14;
  pointer pnVar15;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *tol;
  long lVar16;
  ulong uVar17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_23c;
  cpp_dec_float<100U,_int,_void> local_228;
  pointer local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  local_228.data._M_elems[0xc] = 0;
  local_228.data._M_elems[0xd] = 0;
  local_228.data._M_elems._56_5_ = 0;
  local_228.data._M_elems[8] = 0;
  local_228.data._M_elems[9] = 0;
  local_228.data._M_elems[10] = 0;
  local_228.data._M_elems[0xb] = 0;
  local_228.data._M_elems[4] = 0;
  local_228.data._M_elems[5] = 0;
  local_228.data._M_elems[6] = 0;
  local_228.data._M_elems[7] = 0;
  local_228.data._M_elems[0] = 0;
  local_228.data._M_elems[1] = 0;
  local_228.data._M_elems[2] = 0;
  local_228.data._M_elems[3] = 0;
  local_228.data._M_elems[0xf]._1_3_ = 0;
  local_228.exp = 0;
  local_228.neg = false;
  local_228.prec_elem = 0x10;
  pSVar13 = (this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver;
  pnVar3 = (pSVar13->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1d8 = (pSVar13->coWeights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_178,0,(type *)0x0);
  lVar16 = (long)(((this->
                   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thesolver)->infeasibilities).super_IdxSet.num;
  if (lVar16 < 1) {
    local_23c = -1;
  }
  else {
    local_1d0 = &this->last;
    uVar17 = lVar16 + 1;
    local_23c = -1;
    do {
      pSVar13 = (this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
      piVar14 = (pSVar13->infeasibilities).super_IdxSet.idx;
      iVar2 = piVar14[uVar17 - 2];
      local_228.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar2].m_backend.data;
      local_228.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x10);
      local_228.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_228.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x20);
      local_228.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_228.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x30);
      local_228.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_228.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_228.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_228.exp = pnVar3[iVar2].m_backend.exp;
      local_228.neg = pnVar3[iVar2].m_backend.neg;
      local_228.fpclass = pnVar3[iVar2].m_backend.fpclass;
      local_228.prec_elem = pnVar3[iVar2].m_backend.prec_elem;
      local_1c8.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_1c8.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_1c8.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_1c8.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_1c8.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_1c8.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      local_1c8.data._M_elems._48_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      local_1c8.data._M_elems._56_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      local_1c8.exp = (feastol->m_backend).exp;
      local_1c8.neg = (feastol->m_backend).neg;
      local_1c8.fpclass = (feastol->m_backend).fpclass;
      local_1c8.prec_elem = (feastol->m_backend).prec_elem;
      tol = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(ulong)(local_1c8.data._M_elems[0] | local_1c8.fpclass);
      if ((local_1c8.data._M_elems[0] | local_1c8.fpclass) != cpp_dec_float_finite) {
        local_1c8.neg = (bool)(local_1c8.neg ^ 1);
      }
      if (local_228.fpclass == cpp_dec_float_NaN || local_1c8.fpclass == cpp_dec_float_NaN) {
LAB_0045f094:
        iVar12 = (pSVar13->infeasibilities).super_IdxSet.num;
        (pSVar13->infeasibilities).super_IdxSet.num = iVar12 + -1;
        piVar14[uVar17 - 2] = piVar14[(long)iVar12 + -1];
        (pSVar13->isInfeasible).data[iVar2] = 0;
      }
      else {
        iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_228,&local_1c8);
        if (-1 < iVar12) {
          pSVar13 = (this->
                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver;
          piVar14 = (pSVar13->infeasibilities).super_IdxSet.idx;
          goto LAB_0045f094;
        }
        uStack_50 = CONCAT35(local_228.data._M_elems[0xf]._1_3_,local_228.data._M_elems._56_5_);
        local_88 = (devexpr  [8])local_228.data._M_elems._0_8_;
        auStack_80[0] = local_228.data._M_elems[2];
        auStack_80[1] = local_228.data._M_elems[3];
        local_78[0] = local_228.data._M_elems[4];
        local_78[1] = local_228.data._M_elems[5];
        auStack_70[0] = local_228.data._M_elems[6];
        auStack_70[1] = local_228.data._M_elems[7];
        local_68[0] = local_228.data._M_elems[8];
        local_68[1] = local_228.data._M_elems[9];
        auStack_60[0] = local_228.data._M_elems[10];
        auStack_60[1] = local_228.data._M_elems[0xb];
        local_58[0] = local_228.data._M_elems[0xc];
        local_58[1] = local_228.data._M_elems[0xd];
        local_48 = local_228.exp;
        local_44 = local_228.neg;
        local_40 = local_228.fpclass;
        iStack_3c = local_228.prec_elem;
        local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_1d8[iVar2].m_backend.data;
        local_d8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_1d8[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_1d8[iVar2].m_backend.data + 0x10);
        local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_1d8[iVar2].m_backend.data + 0x20);
        local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_1d8[iVar2].m_backend.data + 0x30);
        local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_d8.m_backend.exp = local_1d8[iVar2].m_backend.exp;
        local_d8.m_backend.neg = local_1d8[iVar2].m_backend.neg;
        local_d8.m_backend.fpclass = local_1d8[iVar2].m_backend.fpclass;
        local_d8.m_backend.prec_elem = local_1d8[iVar2].m_backend.prec_elem;
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_128.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_128.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_128.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_128.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_128.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
        local_128.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
        local_128.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
        local_128.m_backend.exp = (feastol->m_backend).exp;
        local_128.m_backend.neg = (feastol->m_backend).neg;
        local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_1c8,local_88,&local_d8,&local_128,tol);
        local_228.data._M_elems[0xc] = local_1c8.data._M_elems[0xc];
        local_228.data._M_elems[0xd] = local_1c8.data._M_elems[0xd];
        local_228.data._M_elems._56_5_ = local_1c8.data._M_elems._56_5_;
        local_228.data._M_elems[0xf]._1_3_ = local_1c8.data._M_elems[0xf]._1_3_;
        local_228.data._M_elems[8] = local_1c8.data._M_elems[8];
        local_228.data._M_elems[9] = local_1c8.data._M_elems[9];
        local_228.data._M_elems[10] = local_1c8.data._M_elems[10];
        local_228.data._M_elems[0xb] = local_1c8.data._M_elems[0xb];
        local_228.data._M_elems[4] = local_1c8.data._M_elems[4];
        local_228.data._M_elems[5] = local_1c8.data._M_elems[5];
        local_228.data._M_elems[6] = local_1c8.data._M_elems[6];
        local_228.data._M_elems[7] = local_1c8.data._M_elems[7];
        local_228.data._M_elems[0] = local_1c8.data._M_elems[0];
        local_228.data._M_elems[1] = local_1c8.data._M_elems[1];
        local_228.data._M_elems[2] = local_1c8.data._M_elems[2];
        local_228.data._M_elems[3] = local_1c8.data._M_elems[3];
        local_228.exp = local_1c8.exp;
        local_228.neg = local_1c8.neg;
        local_228.fpclass = local_1c8.fpclass;
        local_228.prec_elem = local_1c8.prec_elem;
        if (((local_1c8.fpclass != cpp_dec_float_NaN) && (local_178.fpclass != cpp_dec_float_NaN))
           && (iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (&local_228,&local_178), 0 < iVar12)) {
          pnVar15 = local_1d8 + iVar2;
          local_178.data._M_elems[0] = local_228.data._M_elems[0];
          local_178.data._M_elems[1] = local_228.data._M_elems[1];
          local_178.data._M_elems[2] = local_228.data._M_elems[2];
          local_178.data._M_elems[3] = local_228.data._M_elems[3];
          local_178.data._M_elems[4] = local_228.data._M_elems[4];
          local_178.data._M_elems[5] = local_228.data._M_elems[5];
          local_178.data._M_elems[6] = local_228.data._M_elems[6];
          local_178.data._M_elems[7] = local_228.data._M_elems[7];
          local_178.data._M_elems[8] = local_228.data._M_elems[8];
          local_178.data._M_elems[9] = local_228.data._M_elems[9];
          local_178.data._M_elems[10] = local_228.data._M_elems[10];
          local_178.data._M_elems[0xb] = local_228.data._M_elems[0xb];
          local_178.data._M_elems[0xc] = local_228.data._M_elems[0xc];
          local_178.data._M_elems[0xd] = local_228.data._M_elems[0xd];
          local_178.data._M_elems[0xf]._1_3_ = local_228.data._M_elems[0xf]._1_3_;
          local_178.data._M_elems._56_5_ = local_228.data._M_elems._56_5_;
          local_178.exp = local_228.exp;
          local_178.neg = local_228.neg;
          local_178.fpclass = local_228.fpclass;
          local_178.prec_elem = local_228.prec_elem;
          uVar4 = *(undefined8 *)&(pnVar15->m_backend).data;
          uVar5 = *(undefined8 *)((long)&(pnVar15->m_backend).data + 8);
          uVar6 = *(undefined8 *)((long)&(pnVar15->m_backend).data + 0x10);
          uVar7 = *(undefined8 *)((long)&(pnVar15->m_backend).data + 0x18);
          uVar8 = *(undefined8 *)((long)&(pnVar15->m_backend).data + 0x20);
          uVar9 = *(undefined8 *)((long)&(pnVar15->m_backend).data + 0x28);
          uVar10 = *(undefined8 *)((long)&(pnVar15->m_backend).data + 0x38);
          *(undefined8 *)((local_1d0->m_backend).data._M_elems + 0xc) =
               *(undefined8 *)((long)&(pnVar15->m_backend).data + 0x30);
          *(undefined8 *)((local_1d0->m_backend).data._M_elems + 0xe) = uVar10;
          *(undefined8 *)((local_1d0->m_backend).data._M_elems + 8) = uVar8;
          *(undefined8 *)((local_1d0->m_backend).data._M_elems + 10) = uVar9;
          *(undefined8 *)((local_1d0->m_backend).data._M_elems + 4) = uVar6;
          *(undefined8 *)((local_1d0->m_backend).data._M_elems + 6) = uVar7;
          *(undefined8 *)(local_1d0->m_backend).data._M_elems = uVar4;
          *(undefined8 *)((local_1d0->m_backend).data._M_elems + 2) = uVar5;
          (this->last).m_backend.exp = (pnVar15->m_backend).exp;
          (this->last).m_backend.neg = (pnVar15->m_backend).neg;
          iVar11 = (pnVar15->m_backend).prec_elem;
          (this->last).m_backend.fpclass = (pnVar15->m_backend).fpclass;
          (this->last).m_backend.prec_elem = iVar11;
          local_23c = iVar2;
        }
      }
      uVar17 = uVar17 - 1;
    } while (1 < uVar17);
  }
  return local_23c;
}

Assistant:

int SPxDevexPR<R>::selectLeaveSparse(R feastol)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   int bstI = -1;
   int idx = -1;

   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = fTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         if(x > best)
         {
            best = x;
            bstI = idx;
            last = cpen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         assert(this->thesolver->isInfeasible[idx] == this->VIOLATED
                || this->thesolver->isInfeasible[idx] == this->VIOLATED_AND_CHECKED);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   return bstI;
}